

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

FragmentOutputLayout *
vkt::shaderexecutor::anon_unknown_0::computeFragmentOutputLayout
          (FragmentOutputLayout *__return_storage_ptr__,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols
          )

{
  bool bVar1;
  DataType dataType;
  deBool dVar2;
  pointer pSVar3;
  InternalError *this;
  reference local_50;
  int local_48;
  int ndx;
  int local_34;
  const_iterator cStack_30;
  int numLocations;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_28;
  const_iterator it;
  int location;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols_local;
  FragmentOutputLayout *ret;
  
  it._M_current._7_1_ = 0;
  FragmentOutputLayout::FragmentOutputLayout(__return_storage_ptr__);
  it._M_current._0_4_ = 0;
  local_28._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 (symbols);
  do {
    cStack_30 = std::
                vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
                end(symbols);
    bVar1 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_28);
    dataType = glu::VarType::getBasicType(&pSVar3->varType);
    local_34 = glu::getDataTypeNumLocations(dataType);
    do {
      dVar2 = ::deGetFalse();
      if (dVar2 != 0) {
LAB_00ed1a1c:
        this = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this,(char *)0x0,"!de::contains(ret.locationMap, it->name)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
                   ,0x1e2);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      pSVar3 = __gnu_cxx::
               __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
               ::operator->(&local_28);
      bVar1 = de::
              contains<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                        (&__return_storage_ptr__->locationMap,&pSVar3->name);
      if (bVar1) goto LAB_00ed1a1c;
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_28);
    de::
    insert<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
              (&__return_storage_ptr__->locationMap,&pSVar3->name,(mapped_type_conflict *)&it);
    it._M_current._0_4_ = local_34 + (int)it._M_current;
    for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
                 ::operator*(&local_28);
      std::
      vector<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
      ::push_back(&__return_storage_ptr__->locationSymbols,&local_50);
    }
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

static FragmentOutputLayout computeFragmentOutputLayout (const std::vector<Symbol>& symbols)
{
	FragmentOutputLayout	ret;
	int						location	= 0;

	for (std::vector<Symbol>::const_iterator it = symbols.begin(); it != symbols.end(); ++it)
	{
		const int	numLocations	= glu::getDataTypeNumLocations(it->varType.getBasicType());

		TCU_CHECK_INTERNAL(!de::contains(ret.locationMap, it->name));
		de::insert(ret.locationMap, it->name, location);
		location += numLocations;

		for (int ndx = 0; ndx < numLocations; ++ndx)
			ret.locationSymbols.push_back(&*it);
	}

	return ret;
}